

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O0

void __thiscall ValidateVulnerability::ReadVulnerabilityFile(ValidateVulnerability *this)

{
  int iVar1;
  char *pcVar2;
  OASIS_FLOAT local_14;
  ValidateVulnerability *pVStack_10;
  OASIS_FLOAT totalProbability;
  ValidateVulnerability *this_local;
  
  local_14 = 0.0;
  pVStack_10 = this;
  ReadFirstVulnerabilityLine(this,&local_14);
  if ((this->convertToBin_ & 1U) != 0) {
    (**this->_vptr_ValidateVulnerability)();
  }
  while (pcVar2 = fgets((this->super_Validate).line_,0x1000,_stdin), pcVar2 != (char *)0x0) {
    iVar1 = ScanLine(this);
    if (iVar1 == 4) {
      CheckVulnerabilityID(this);
      if (((this->v_).vulnerability_id == this->prevVulID_) &&
         ((this->v_).intensity_bin_id == this->prevIntBinID_)) {
        local_14 = (this->v_).probability + local_14;
      }
      else {
        CheckProbability(this,local_14);
        if ((this->v_).vulnerability_id == this->prevVulID_) {
          CheckIntensityBinID(this);
        }
        if ((this->allIntensityBinsCheck_ & 1U) != 0) {
          SetIntensityBinIDs(this);
        }
        if (((this->useIndexFile_ & 1U) != 0) && ((this->v_).vulnerability_id != this->prevVulID_))
        {
          (*this->_vptr_ValidateVulnerability[1])();
        }
        this->prevDamageBinID_ = 0;
        local_14 = (this->v_).probability;
      }
      CheckDamageBinID(this);
      if ((this->convertToBin_ & 1U) != 0) {
        (**this->_vptr_ValidateVulnerability)();
      }
      StoreLine(this);
    }
    else {
      fprintf(_stderr,"ERROR: Invalid data in line %d:\n%s\n",
              (ulong)(uint)(this->super_Validate).lineno_,&this->super_Validate);
      Validate::PrintErrorMessage(&this->super_Validate);
    }
  }
  CheckProbability(this,local_14);
  if (((this->v_).vulnerability_id == this->prevVulID_) &&
     ((this->v_).intensity_bin_id != this->prevIntBinID_)) {
    CheckIntensityBinID(this);
  }
  if ((this->useIndexFile_ & 1U) != 0) {
    (*this->_vptr_ValidateVulnerability[1])();
  }
  if ((this->allIntensityBinsCheck_ & 1U) != 0) {
    CheckAllIntensityBinsPresent(this);
  }
  return;
}

Assistant:

void ValidateVulnerability::ReadVulnerabilityFile() {

  OASIS_FLOAT totalProbability = 0.0;
  ReadFirstVulnerabilityLine(totalProbability);
  // Write first vulnerability line
  if (convertToBin_) WriteBinVulnerabilityFile();

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      CheckVulnerabilityID();

      // New vulnerability and/or intensity bin IDs.
      // Check probabilities sum to 1.0  for each vulnerability ID-intensity
      // bin ID combination and intensity bin IDs are contiguous.
      if ((v_.vulnerability_id != prevVulID_) ||
	  (v_.intensity_bin_id != prevIntBinID_)) {

        CheckProbability(totalProbability);
	if (v_.vulnerability_id == prevVulID_) CheckIntensityBinID();
	if (allIntensityBinsCheck_) SetIntensityBinIDs();
	
	if (useIndexFile_) {
	  if (v_.vulnerability_id != prevVulID_) {

	// if new vulnerability ID then write to index file if requested on
	// command line
	  WriteIdxVulnerabilityFile();

	  }
	}

	// Reset for next vulnerability-intensity bin combination
	prevDamageBinID_ = 0;
	totalProbability = v_.probability;

      } else {   // Only damage bin ID changes

	totalProbability += v_.probability;

      }

      CheckDamageBinID();

      if (convertToBin_) {

        WriteBinVulnerabilityFile();

      }

      StoreLine();
      continue;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  // Check probabilities sum to 1.0 for last vulnerability ID-intensity bin ID
  // combination and intensity bin IDs are contguous.
  CheckProbability(totalProbability);
  if ((v_.vulnerability_id == prevVulID_) &&
      (v_.intensity_bin_id != prevIntBinID_)) CheckIntensityBinID();
  // Write last event to index file if requested on command line
  if (useIndexFile_) WriteIdxVulnerabilityFile();

  if (allIntensityBinsCheck_) CheckAllIntensityBinsPresent();

}